

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hn-state.cpp
# Opt level: O2

URI * __thiscall HN::getItemURI_abi_cxx11_(URI *__return_storage_ptr__,HN *this,ItemId id)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  std::__cxx11::to_string(&local_30,(int)this);
  std::operator+(&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 kAPIItem_abi_cxx11_,&local_30);
  std::operator+(__return_storage_ptr__,&local_50,".json");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

URI getItemURI(ItemId id) {
        return kAPIItem + std::to_string(id) + ".json";
    }